

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointTest.cpp
# Opt level: O1

void __thiscall PointIncrement::test_method(PointIncrement *this)

{
  Vector3d v;
  RealSpace R3;
  Point x;
  Matrix<double,_3,_1,_0,_3,_1> local_270;
  RealScalar local_258;
  undefined1 local_250;
  undefined8 local_248;
  shared_count sStack_240;
  Matrix<double,_3,_1,_0,_3,_1> *local_238;
  ulong uStack_230;
  undefined8 *local_228;
  char **local_220;
  undefined8 uStack_218;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_210;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  code *local_1b8 [11];
  void *local_160;
  void *local_150;
  Ref local_140 [8];
  void *local_138;
  ConstSubPoint local_128 [272];
  
  mnf::RealSpace::RealSpace((RealSpace *)local_1b8,3);
  local_270.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       1.0;
  local_270.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       2.0;
  local_270.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       3.0;
  mnf::Manifold::getZero();
  local_220 = (char **)0x0;
  uStack_218 = 0;
  local_238 = &local_270;
  uStack_230 = 3;
  mnf::Point::increment(local_140);
  free(local_220);
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c8,0x38);
  mnf::SubPoint::value();
  local_258 = 1e-12;
  local_250 = Eigen::internal::
              isApprox_selector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_false>
              ::run(&local_270,&local_210,&local_258);
  local_248 = 0;
  sStack_240.pi_ = (sp_counted_base *)0x0;
  local_220 = &local_1e8;
  local_1e8 = "v.isApprox(x.value())";
  local_1e0 = "";
  uStack_230 = uStack_230 & 0xffffffffffffff00;
  local_238 = (Matrix<double,_3,_1,_0,_3,_1> *)&PTR__lazy_ostream_00129c08;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_1f0 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_240);
  mnf::ConstSubPoint::~ConstSubPoint(local_128);
  free(local_138);
  local_1b8[0] = mnf::operator+;
  free(local_150);
  free(local_160);
  mnf::Manifold::~Manifold((Manifold *)local_1b8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(PointIncrement)
{
  RealSpace R3(3);
  Eigen::Vector3d v(1, 2, 3);
  Point x = R3.getZero();
  x.increment(v);
  BOOST_CHECK(v.isApprox(x.value()));
}